

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtentBuilder.h
# Opt level: O3

Extent<double> * Parfait::ExtentBuilder::intersection<double>(Extent<double> *e1,Extent<double> *e2)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  int i;
  long lVar5;
  Extent<double> *in_RDI;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  dVar2 = (e1->lo).pos._M_elems[0];
  if ((dVar2 < (e2->hi).pos._M_elems[0] || dVar2 == (e2->hi).pos._M_elems[0]) &&
     (dVar2 = (e2->lo).pos._M_elems[0],
     dVar2 < (e1->hi).pos._M_elems[0] || dVar2 == (e1->hi).pos._M_elems[0])) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if ((uVar6 == 2) ||
         (dVar2 = (e1->lo).pos._M_elems[uVar6 + 1], pdVar1 = (e2->hi).pos._M_elems + uVar6 + 1,
         *pdVar1 <= dVar2 && dVar2 != *pdVar1)) break;
      dVar2 = (e2->lo).pos._M_elems[uVar6 + 1];
      pdVar1 = (e1->hi).pos._M_elems + uVar6 + 1;
      uVar4 = uVar6 + 1;
    } while (dVar2 < *pdVar1 || dVar2 == *pdVar1);
    if (1 < uVar6) {
      lVar5 = 0;
      do {
        dVar2 = (e2->lo).pos._M_elems[lVar5];
        uVar7 = SUB84(dVar2,0);
        uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar3 = (e1->lo).pos._M_elems[lVar5];
        if (dVar2 <= dVar3) {
          uVar7 = SUB84(dVar3,0);
          uVar8 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        (in_RDI->lo).pos._M_elems[lVar5] = (double)CONCAT44(uVar8,uVar7);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        dVar2 = (e2->hi).pos._M_elems[lVar5];
        uVar7 = SUB84(dVar2,0);
        uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        dVar3 = (e1->hi).pos._M_elems[lVar5];
        if (dVar3 <= dVar2) {
          uVar7 = SUB84(dVar3,0);
          uVar8 = (undefined4)((ulong)dVar3 >> 0x20);
        }
        (in_RDI->hi).pos._M_elems[lVar5] = (double)CONCAT44(uVar8,uVar7);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      return in_RDI;
    }
  }
  (in_RDI->lo).pos._M_elems[0] = 1.79769313486232e+308;
  (in_RDI->lo).pos._M_elems[1] = 1.79769313486232e+308;
  (in_RDI->lo).pos._M_elems[2] = 1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[0] = -1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[1] = -1.79769313486232e+308;
  (in_RDI->hi).pos._M_elems[2] = -1.79769313486232e+308;
  return in_RDI;
}

Assistant:

Extent<T> intersection(Extent<T>& e1, const Extent<T>& e2) {
            if(not e1.contains(e2))
                return createEmptyBuildableExtent<T>();
            Extent<T> e;
            for(int i = 0; i < 3; i++)
                e.lo[i] = (e1.lo[i] < e2.lo[i])?(e2.lo[i]):(e1.lo[i]);

            for(int i = 0; i < 3; i++)
                e.hi[i] = (e1.hi[i] > e2.hi[i])?(e2.hi[i]):(e1.hi[i]);
            return e;
        }